

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFSInv.h
# Opt level: O2

bool __thiscall dg::pta::PointerAnalysisFSInv::afterProcessed(PointerAnalysisFSInv *this,PSNode *n)

{
  int iVar1;
  long *plVar2;
  MemoryMapT *mm;
  bool bVar3;
  bool bVar4;
  const_iterator __begin3;
  long *plVar5;
  
  iVar1 = *(int *)(n + 0x90);
  if (iVar1 == 0x11) {
    bVar3 = invalidateMemory(n);
    return bVar3;
  }
  if (iVar1 != 0x10) {
    if (iVar1 == 0xf) {
      bVar3 = handleInvalidateLocals(n);
      return bVar3;
    }
    bVar3 = PointerAnalysisFS::afterProcessed(&this->super_PointerAnalysisFS,n);
    plVar5 = *(long **)(n + 0x40);
    plVar2 = *(long **)(n + 0x48);
    if (8 < (ulong)((long)plVar2 - (long)plVar5)) {
      mm = *(MemoryMapT **)(n + 0x10);
      for (; plVar5 != plVar2; plVar5 = plVar5 + 1) {
        if (*(MemoryMapT **)(*plVar5 + 0x10) != (MemoryMapT *)0x0) {
          bVar4 = handleUninitialized(this,mm,*(MemoryMapT **)(*plVar5 + 0x10));
          bVar3 = (bool)(bVar3 | bVar4);
        }
      }
    }
    return bVar3;
  }
  bVar3 = handleFree(n);
  return bVar3;
}

Assistant:

bool afterProcessed(PSNode *n) override {
        if (n->getType() == PSNodeType::INVALIDATE_LOCALS)
            return handleInvalidateLocals(n);
        if (n->getType() == PSNodeType::INVALIDATE_OBJECT)
            return invalidateMemory(n);
        if (n->getType() == PSNodeType::FREE)
            return handleFree(n);

        assert(n->getType() != PSNodeType::FREE &&
               n->getType() != PSNodeType::INVALIDATE_OBJECT &&
               n->getType() != PSNodeType::INVALIDATE_LOCALS);

        bool ret = PointerAnalysisFS::afterProcessed(n);

        // check that all pointers in this memory map
        // are initialized in all predecessors and
        // set them to invalidated otherwise
        MemoryMapT *mm = n->getData<MemoryMapT>();
        assert(mm && "Do not have memory map");
        if (n->predecessorsNum() > 1) {
            for (PSNode *p : n->predecessors()) {
                if (MemoryMapT *pm = p->getData<MemoryMapT>()) {
                    ret |= handleUninitialized(mm, pm);
                }
            }
        }
        return ret;
    }